

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O3

EVP_PKEY_CTX * evp_pkey_ctx_new(EVP_PKEY *pkey,ENGINE *e,EVP_PKEY_METHOD *pmeth)

{
  int iVar1;
  EVP_PKEY_CTX *orig_ptr;
  
  orig_ptr = (EVP_PKEY_CTX *)OPENSSL_zalloc(0x30);
  if (orig_ptr != (EVP_PKEY_CTX *)0x0) {
    orig_ptr->engine = e;
    orig_ptr->pmeth = pmeth;
    orig_ptr->operation = 0;
    if (pkey != (EVP_PKEY *)0x0) {
      EVP_PKEY_up_ref(pkey);
      orig_ptr->pkey = pkey;
    }
    if (pmeth->init == (_func_int_EVP_PKEY_CTX_ptr *)0x0) {
      return orig_ptr;
    }
    iVar1 = (*pmeth->init)(orig_ptr);
    if (0 < iVar1) {
      return orig_ptr;
    }
    EVP_PKEY_free((EVP_PKEY *)orig_ptr->pkey);
    OPENSSL_free(orig_ptr);
  }
  return (EVP_PKEY_CTX *)0x0;
}

Assistant:

static EVP_PKEY_CTX *evp_pkey_ctx_new(EVP_PKEY *pkey, ENGINE *e,
                                      const EVP_PKEY_METHOD *pmeth) {
  EVP_PKEY_CTX *ret =
      reinterpret_cast<EVP_PKEY_CTX *>(OPENSSL_zalloc(sizeof(EVP_PKEY_CTX)));
  if (!ret) {
    return NULL;
  }

  ret->engine = e;
  ret->pmeth = pmeth;
  ret->operation = EVP_PKEY_OP_UNDEFINED;

  if (pkey) {
    EVP_PKEY_up_ref(pkey);
    ret->pkey = pkey;
  }

  if (pmeth->init) {
    if (pmeth->init(ret) <= 0) {
      EVP_PKEY_free(ret->pkey);
      OPENSSL_free(ret);
      return NULL;
    }
  }

  return ret;
}